

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O3

int mbedtls_x509_crl_parse_file(mbedtls_x509_crl *chain,char *path)

{
  int iVar1;
  size_t sVar2;
  uchar *buf;
  size_t n;
  uchar *local_20;
  size_t local_18;
  
  iVar1 = mbedtls_pk_load_file(path,&local_20,&local_18);
  if (iVar1 == 0) {
    iVar1 = mbedtls_x509_crl_parse(chain,local_20,local_18);
    if (local_18 != 0) {
      sVar2 = 0;
      do {
        local_20[sVar2] = '\0';
        sVar2 = sVar2 + 1;
      } while (local_18 != sVar2);
    }
    free(local_20);
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_crl_parse_file( mbedtls_x509_crl *chain, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = mbedtls_pk_load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_x509_crl_parse( chain, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}